

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surjection_impl.h
# Opt level: O2

int secp256k1_surjection_compute_public_keys
              (secp256k1_gej *pubkeys,size_t n_pubkeys,secp256k1_generator *input_tags,
              size_t n_input_tags,uchar *used_tags,secp256k1_generator *output_tag,
              size_t input_index,size_t *ring_input_index)

{
  uint64_t *puVar1;
  byte bVar2;
  ulong in_RAX;
  undefined8 extraout_RAX;
  long lVar3;
  uchar *puVar4;
  secp256k1_ge tmpge;
  secp256k1_ge local_88;
  
  lVar3 = 0;
  for (puVar4 = (uchar *)0x0; input_tags != (secp256k1_generator *)puVar4; puVar4 = puVar4 + 1) {
    bVar2 = *(byte *)(n_input_tags + ((ulong)puVar4 >> 3));
    in_RAX = (ulong)bVar2;
    if ((bVar2 >> ((uint)puVar4 & 7) & 1) != 0) {
      secp256k1_generator_load(&local_88,(secp256k1_generator *)n_pubkeys);
      secp256k1_ge_neg(&local_88,&local_88);
      pubkeys[lVar3].infinity = local_88.infinity;
      pubkeys[lVar3].x.n[0] = local_88.x.n[0];
      pubkeys[lVar3].x.n[1] = local_88.x.n[1];
      puVar1 = pubkeys[lVar3].x.n + 2;
      *puVar1 = local_88.x.n[2];
      puVar1[1] = local_88.x.n[3];
      pubkeys[lVar3].x.n[4] = local_88.x.n[4];
      pubkeys[lVar3].y.n[0] = local_88.y.n[0];
      pubkeys[lVar3].y.n[1] = local_88.y.n[1];
      puVar1 = pubkeys[lVar3].y.n + 2;
      *puVar1 = local_88.y.n[2];
      puVar1[1] = local_88.y.n[3];
      pubkeys[lVar3].y.n[4] = local_88.y.n[4];
      pubkeys[lVar3].z.n[0] = 1;
      puVar1 = pubkeys[lVar3].z.n + 1;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = pubkeys[lVar3].z.n + 3;
      *puVar1 = 0;
      puVar1[1] = 0;
      secp256k1_generator_load(&local_88,(secp256k1_generator *)used_tags);
      secp256k1_gej_add_ge_var(pubkeys + lVar3,pubkeys + lVar3,&local_88,(secp256k1_fe *)0x0);
      in_RAX = CONCAT71((int7)((ulong)extraout_RAX >> 8),
                        output_tag != (secp256k1_generator *)puVar4 || input_index == 0);
      if (output_tag == (secp256k1_generator *)puVar4 && input_index != 0) {
        *(long *)input_index = lVar3;
        in_RAX = input_index;
      }
      lVar3 = lVar3 + 1;
    }
    n_pubkeys = n_pubkeys + 0x40;
  }
  return (int)in_RAX;
}

Assistant:

SECP256K1_INLINE static int secp256k1_surjection_compute_public_keys(secp256k1_gej *pubkeys, size_t n_pubkeys, const secp256k1_generator *input_tags, size_t n_input_tags, const unsigned char *used_tags, const secp256k1_generator *output_tag, size_t input_index, size_t *ring_input_index) {
    size_t i;
    size_t j = 0;
    for (i = 0; i < n_input_tags; i++) {
        if (used_tags[i / 8] & (1 << (i % 8))) {
            secp256k1_ge tmpge;
            secp256k1_generator_load(&tmpge, &input_tags[i]);
            secp256k1_ge_neg(&tmpge, &tmpge);

            VERIFY_CHECK(j < SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS);
            VERIFY_CHECK(j < n_pubkeys);
            secp256k1_gej_set_ge(&pubkeys[j], &tmpge);

            secp256k1_generator_load(&tmpge, output_tag);
            secp256k1_gej_add_ge_var(&pubkeys[j], &pubkeys[j], &tmpge, NULL);
            if (ring_input_index != NULL && input_index == i) {
                *ring_input_index = j;
            }
            j++;
        }
    }
    /* Caller needs to ensure that the number of set bits in used_tags (which we counted in j) equals n_pubkeys. */
    VERIFY_CHECK(j == n_pubkeys);
    return 1;
}